

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

transformations_t * opengv::absolute_pose::upnp(AbsoluteAdapterBase *adapter,Indices *indices)

{
  double dVar1;
  double dVar2;
  Scalar SVar3;
  Scalar SVar4;
  long *plVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  size_type sVar9;
  Scalar *pSVar10;
  reference pvVar11;
  Indices *in_RDX;
  long *in_RSI;
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  *in_RDI;
  Scalar SVar12;
  __type _Var13;
  __type _Var14;
  undefined8 uVar23;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0> PVar36;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar37;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  PVar38;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  PVar39;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0> PVar40;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>
  PVar41;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>
  PVar42;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> PVar43;
  transformation_t newTransformation_2;
  rotation_t Rinv_2;
  translation_t tinv_2;
  Matrix<double,_10,_1,_0,_10,_1> s_2;
  Vector4d q_2;
  transformation_t newTransformation_1;
  translation_t tinv_1;
  Matrix<double,_10,_1,_0,_10,_1> s_1;
  quaternion_t q_1;
  rotation_t Rinv2;
  Vector3d cay;
  size_t i_6;
  bool allPositive;
  vector<double,_std::allocator<double>_> roots;
  vector<double,_std::allocator<double>_> characteristicPolynomial;
  Matrix3d Jacobian;
  Vector3d val;
  Matrix<double,_3,_1,_0,_3,_1> bi_1;
  Matrix<double,_3,_10,_0,_3,_10> Ai_1;
  Matrix<double,_3,_3,_0,_3,_3> temp_1;
  Matrix<double,_3,_1,_0,_3,_1> p_4;
  Matrix<double,_3,_1,_0,_3,_1> v_3;
  Matrix<double,_3,_1,_0,_3,_1> f_5;
  int i_5;
  Matrix<double,_3,_1,_0,_3,_1> p_3;
  Matrix<double,_3,_3,_0,_3,_3> Vk_1;
  Matrix<double,_3,_1,_0,_3,_1> f_4;
  int i_4;
  rotation_t Rinv_1;
  size_t q;
  double gamma_cay;
  Matrix<double,_1,_10,_1,_1,_10> C_cay;
  Matrix<double,_10,_10,_0,_10,_10> M_cay;
  Matrix<double,_3,_10,_0,_3,_10> I_cay;
  Vector3d p_est;
  Matrix<double,_3,_1,_0,_3,_1> v_2;
  Matrix<double,_3,_1,_0,_3,_1> p_2;
  Matrix<double,_3,_1,_0,_3,_1> f_3;
  int j;
  int count_negative;
  transformation_t newTransformation;
  translation_t tinv;
  Matrix<double,_10,_1,_0,_10,_1> s;
  rotation_t Rinv;
  int i_3;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  quaternions2;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  quaternions1;
  Matrix<double,_3,_1,_0,_3,_1> bi;
  Matrix<double,_3,_10,_0,_3,_10> Ai;
  Matrix<double,_3,_3,_0,_3,_3> temp;
  Matrix<double,_3,_1,_0,_3,_1> p_1;
  Matrix<double,_3,_1,_0,_3,_1> v_1;
  Matrix<double,_3,_1,_0,_3,_1> f_2;
  int i_2;
  double gamma;
  Matrix<double,_1,_10,_1,_1,_10> C;
  Matrix<double,_10,_10,_0,_10,_10> M;
  Matrix<double,_3,_1,_0,_3,_1> v;
  Matrix<double,_3,_1,_0,_3,_1> p;
  Matrix<double,_3,_3,_0,_3,_3> Vk;
  Matrix<double,_3,_1,_0,_3,_1> f_1;
  int i_1;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *in_stack_000020e8;
  Matrix<double,_3,_10,_0,_3,_10> Phi;
  Matrix<double,_3,_1,_0,_3,_1> J;
  Matrix<double,_3,_10,_0,_3,_10> I;
  Matrix<double,_3,_3,_0,_3,_3> H;
  Matrix<double,_3,_3,_0,_3,_3> H_inv;
  Matrix<double,_3,_1,_0,_3,_1> f;
  int i;
  Matrix<double,_3,_3,_0,_3,_3> F;
  transformations_t *transformations;
  undefined4 in_stack_ffffffffffffdaa0;
  int in_stack_ffffffffffffdaa4;
  undefined4 in_stack_ffffffffffffdaa8;
  int in_stack_ffffffffffffdaac;
  value_type *in_stack_ffffffffffffdab0;
  TransposeReturnType in_stack_ffffffffffffdab8;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
  *in_stack_ffffffffffffdac0;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffdac8;
  TransposeReturnType in_stack_ffffffffffffdad0;
  dense_product_base<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
  *in_stack_ffffffffffffdad8;
  LhsNested in_stack_ffffffffffffdae0;
  StorageBaseType *in_stack_ffffffffffffdae8;
  LhsNested in_stack_ffffffffffffdaf0;
  Matrix<double,_10,_1,_0,_10,_1> *in_stack_ffffffffffffdb40;
  Vector4d *in_stack_ffffffffffffdb48;
  Matrix3d *in_stack_ffffffffffffdba0;
  double in_stack_ffffffffffffdba8;
  Matrix<double,_1,_10,_1,_1,_10> *in_stack_ffffffffffffdbb0;
  Matrix<double,_10,_10,_0,_10,_10> *in_stack_ffffffffffffdbb8;
  quaternion_t *in_stack_ffffffffffffdbd0;
  Matrix<double,_3,_10,_0,_3,_10> *in_stack_ffffffffffffdc90;
  Vector3d *in_stack_ffffffffffffdc98;
  RhsNested in_stack_ffffffffffffdd70;
  RhsNested in_stack_ffffffffffffdda0;
  ulong local_1b38;
  vector<double,_std::allocator<double>_> local_1b28;
  undefined8 local_1b10;
  double local_1b08;
  double local_1b00;
  undefined8 local_1af8;
  Vector3d local_1af0 [5];
  non_const_type local_1a78;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_1a70;
  non_const_type local_1a60;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>
  local_1a58;
  non_const_type local_1a48;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>
  local_1a40;
  non_const_type local_1898;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_1890;
  undefined1 local_1820 [24];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_1808;
  undefined1 local_17e0 [24];
  undefined1 local_17c8 [24];
  undefined1 local_17b0 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_1768;
  int local_173c;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>
  local_1718;
  undefined1 local_1708 [24];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_16f0;
  non_const_type local_16c0;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_16b8;
  undefined1 local_1628 [24];
  undefined1 local_1610 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_15c8;
  int local_159c;
  ulong local_1540;
  double local_1538;
  undefined4 local_10cc;
  non_const_type local_10c8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_10c0;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_10b0;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  *in_stack_ffffffffffffefa8;
  double in_stack_ffffffffffffefb0;
  Matrix<double,_1,_10,_1,_1,_10> *in_stack_ffffffffffffefb8;
  Matrix<double,_10,_10,_0,_10,_10> *in_stack_ffffffffffffefc0;
  undefined1 local_1030 [24];
  undefined1 local_1018 [24];
  undefined1 local_1000 [24];
  undefined1 local_fe8 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_fa0;
  int local_f78;
  int local_f74;
  non_const_type local_e68;
  Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>
  local_de8;
  int local_cfc;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_cf8;
  byte local_cdd;
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_cd0;
  non_const_type local_cb8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_cb0;
  non_const_type local_ca0;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>
  local_c98;
  non_const_type local_c88;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>
  local_c80;
  non_const_type local_ad0;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_ac8;
  undefined1 local_a58 [24];
  undefined1 local_a40 [24];
  undefined1 local_a28 [24];
  undefined1 local_a10 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_9c8;
  int local_99c;
  double local_998;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_5f0;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0> local_5e0
  ;
  undefined1 local_5d0 [24];
  undefined1 local_5b8 [32];
  non_const_type local_598;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_590;
  undefined1 local_500 [24];
  undefined1 local_4e8 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_4a0;
  int local_474;
  XprTypeNested local_248;
  size_t local_1f0;
  non_const_type local_148;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_140;
  undefined1 local_130 [24];
  undefined1 local_118 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_d0;
  int local_a4;
  Indices *local_48;
  long *local_40;
  
  local_48 = in_RDX;
  local_40 = in_RSI;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
  for (local_a4 = 0; iVar6 = local_a4, sVar7 = Indices::size(local_48), plVar5 = local_40,
      iVar6 < (int)sVar7; local_a4 = local_a4 + 1) {
    iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
    (**(code **)(*plVar5 + 0x28))(local_118,plVar5,(long)iVar6);
    plVar5 = local_40;
    iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
    (**(code **)(*plVar5 + 0x10))(local_130,plVar5,(long)iVar6);
    local_d0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                          CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                          (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                          CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    local_148 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    local_140 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+=
              (in_stack_ffffffffffffdac8,in_stack_ffffffffffffdac0);
  }
  local_1f0 = Indices::size(local_48);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::operator*((unsigned_long *)in_stack_ffffffffffffdaf0,in_stack_ffffffffffffdae8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
  ::operator-((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
               *)in_stack_ffffffffffffdad0.m_matrix,in_stack_ffffffffffffdac8);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
  local_248 = (XprTypeNested)
              Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse
                        ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
  Eigen::Matrix<double,3,3,0,3,3>::Matrix<Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
             (EigenBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
             CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::Zero();
  Eigen::Matrix<double,3,10,0,3,10>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,10,0,3,10>>>
            ((Matrix<double,_3,_10,_0,_3,_10> *)
             CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>_>_>
              *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
  Eigen::Matrix<double,_3,_10,_0,_3,_10>::Matrix((Matrix<double,_3,_10,_0,_3,_10> *)0x717709);
  for (local_474 = 0; iVar6 = local_474, sVar7 = Indices::size(local_48), plVar5 = local_40,
      iVar6 < (int)sVar7; local_474 = local_474 + 1) {
    iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
    (**(code **)(*plVar5 + 0x28))(local_4e8,plVar5,(long)iVar6);
    plVar5 = local_40;
    iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
    (**(code **)(*plVar5 + 0x10))(local_500,plVar5,(long)iVar6);
    local_4a0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    local_598 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    local_590 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>>
    ::operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                 *)in_stack_ffffffffffffdad0.m_matrix,
                (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)in_stack_ffffffffffffdac8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffdac0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_ffffffffffffdab8.m_matrix);
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>,0>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)
               CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_0>_>
                *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    plVar5 = local_40;
    iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
    (**(code **)(*plVar5 + 0x30))(local_5b8,plVar5,(long)iVar6);
    plVar5 = local_40;
    iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
    (**(code **)(*plVar5 + 0x20))(local_5d0,plVar5,(long)iVar6);
    fill3x10(in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
    local_5e0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           (MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::MatrixBase<Eigen::Matrix<double,3,10,0,3,10>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)in_stack_ffffffffffffdac8,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                *)in_stack_ffffffffffffdac0);
    local_5f0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdac8,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_ffffffffffffdac0);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>::Zero();
  Eigen::Matrix<double,10,10,0,10,10>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,10,10,0,10,10>>>
            ((Matrix<double,_10,_10,_0,_10,_10> *)
             CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_>
              *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
  Eigen::DenseBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>::Zero();
  Eigen::Matrix<double,1,10,1,1,10>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,10,1,1,10>>>
            ((Matrix<double,_1,_10,_1,_1,_10> *)
             CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>_>
              *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
  local_998 = 0.0;
  for (local_99c = 0; iVar6 = local_99c, sVar7 = Indices::size(local_48), plVar5 = local_40,
      iVar6 < (int)sVar7; local_99c = local_99c + 1) {
    iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
    (**(code **)(*plVar5 + 0x28))(local_a10,plVar5,(long)iVar6);
    plVar5 = local_40;
    iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
    (**(code **)(*plVar5 + 0x10))(local_a28,plVar5,(long)iVar6);
    local_9c8 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    plVar5 = local_40;
    iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
    (**(code **)(*plVar5 + 0x20))(local_a40,plVar5,(long)iVar6);
    plVar5 = local_40;
    iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
    (**(code **)(*plVar5 + 0x30))(local_a58,plVar5,(long)iVar6);
    fill3x10(in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
    local_ad0 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    local_ac8 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>>
    ::operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                 *)in_stack_ffffffffffffdad0.m_matrix,
                (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)in_stack_ffffffffffffdac8);
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)
               CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::MatrixBase<Eigen::Matrix<double,3,10,0,3,10>>::operator+
              ((MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
               in_stack_ffffffffffffdad0.m_matrix,
               (MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)in_stack_ffffffffffffdac8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffdac0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>_>_>
                *)in_stack_ffffffffffffdab8.m_matrix);
    Eigen::Matrix<double,3,10,0,3,10>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,10,0,3,10>const,Eigen::Matrix<double,3,10,0,3,10>const>,0>>
              ((Matrix<double,_3,_10,_0,_3,_10> *)
               CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_0>_>
                *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffdac0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               in_stack_ffffffffffffdad0.m_matrix,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdac8);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 *)in_stack_ffffffffffffdac0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_ffffffffffffdab8.m_matrix);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
               (EigenBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    local_c88 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    local_c80 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,10,0,3,10>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>_> *
                           )CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           (MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::MatrixBase<Eigen::Matrix<double,10,10,0,10,10>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)in_stack_ffffffffffffdac8,
               (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                *)in_stack_ffffffffffffdac0);
    local_ca0 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    local_c98 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           (MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    Eigen::MatrixBase<Eigen::Matrix<double,1,10,1,1,10>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)in_stack_ffffffffffffdac8,
               (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                *)in_stack_ffffffffffffdac0);
    local_cb8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    local_cb0 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_ffffffffffffdad8)
    ;
    local_998 = SVar12 + local_998;
  }
  std::
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            *)0x717db6);
  sVar7 = Indices::size(local_48);
  if (sVar7 < 5) {
    auVar22 = ZEXT864((ulong)local_998);
    modules::upnp_main((Matrix<double,_10,_10,_0,_10,_10> *)
                       Phi.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
                       m_data.array[2],
                       (Matrix<double,_1,_10,_1,_1,_10> *)
                       Phi.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
                       m_data.array[1],
                       Phi.super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>.m_storage.
                       m_data.array[0],in_stack_000020e8);
  }
  else {
    auVar22 = ZEXT864((ulong)local_998);
    modules::upnp_main_sym
              (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,
               in_stack_ffffffffffffefa8);
  }
  local_cdd = 0;
  std::
  vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            *)0x717e5d);
  std::
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            *)0x717e6c);
  local_cfc = 0;
  while( true ) {
    uVar8 = (ulong)local_cfc;
    sVar9 = std::
            vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            ::size(&local_cd0);
    if (sVar9 <= uVar8) break;
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::operator[](&local_cd0,(long)local_cfc);
    math::quaternion2rot(in_stack_ffffffffffffdbd0);
    Eigen::Matrix<double,_10,_1,_0,_10,_1>::Matrix((Matrix<double,_10,_1,_0,_10,_1> *)0x717ee2);
    std::
    vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::operator[](&local_cd0,(long)local_cfc);
    modules::upnp_fill_s(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
    PVar36 = Eigen::MatrixBase<Eigen::Matrix<double,3,10,0,3,10>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                        CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                        (MatrixBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_> *)
                        CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    local_de8 = PVar36;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,10,0,3,10>,Eigen::Matrix<double,10,1,0,10,1>,0>>
    ::operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>
                 *)in_stack_ffffffffffffdad0.m_matrix,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdac8);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,10,0,3,10>,Eigen::Matrix<double,10,1,0,10,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
    sVar9 = std::
            vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            ::size(in_RDI);
    if (sVar9 == 0) {
      Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x717fb0);
      local_e68 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                             CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_ffffffffffffdab8.m_matrix,(Index)in_stack_ffffffffffffdab0,
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8));
      Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_ffffffffffffdab8.m_matrix,(Index)in_stack_ffffffffffffdab0,
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8));
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>::operator-
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_> *)
                 in_stack_ffffffffffffdac0);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>const>>
      ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>_>
                   *)in_stack_ffffffffffffdac0,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  in_stack_ffffffffffffdab8.m_matrix);
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,1>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_ffffffffffffdab8.m_matrix,(Index)in_stack_ffffffffffffdab0,
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8));
      Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      std::
      vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                   *)in_stack_ffffffffffffdab8.m_matrix,(value_type *)in_stack_ffffffffffffdab0);
    }
    local_f74 = 0;
    local_f78 = 0;
    while( true ) {
      iVar6 = local_f78;
      uVar23 = auVar22._8_8_;
      sVar7 = Indices::size(local_48);
      plVar5 = local_40;
      if ((int)sVar7 <= iVar6) break;
      iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
      (**(code **)(*plVar5 + 0x28))(local_fe8,plVar5,(long)iVar6);
      plVar5 = local_40;
      iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
      (**(code **)(*plVar5 + 0x10))(local_1000,plVar5,(long)iVar6);
      PVar37 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                          CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                          (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                          CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      local_fa0 = PVar37;
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      plVar5 = local_40;
      iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
      (**(code **)(*plVar5 + 0x30))(local_1018,plVar5,(long)iVar6);
      plVar5 = local_40;
      iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
      (**(code **)(*plVar5 + 0x20))(local_1030,plVar5,(long)iVar6);
      PVar37 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                          CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                          (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                          CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      local_10b0 = PVar37;
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
      ::operator+((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                   *)in_stack_ffffffffffffdad0.m_matrix,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdac8);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator-((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)in_stack_ffffffffffffdad0.m_matrix,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdac8);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      local_10c8 = (non_const_type)
                   Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                             ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                              CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      PVar38 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                         ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                          CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                          (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                          CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      local_10c0 = PVar38;
      SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                         (in_stack_ffffffffffffdad8);
      auVar22 = ZEXT1664((undefined1  [16])0x0);
      if (SVar12 < 0.0) {
        local_f74 = local_f74 + 1;
      }
      local_f78 = local_f78 + 1;
    }
    auVar15._0_8_ = (double)local_f74;
    auVar15._8_8_ = uVar23;
    auVar16 = auVar15;
    sVar7 = Indices::size(local_48);
    auVar16 = vcvtusi2sd_avx512f(auVar16,sVar7);
    auVar17 = vfmadd213sd_fma(ZEXT816(0x3fc999999999999a),auVar16,ZEXT816(0x3fe0000000000000));
    auVar16 = vroundsd_avx(auVar16,auVar17,9);
    auVar22 = ZEXT1664(auVar16);
    if (auVar15._0_8_ < auVar16._0_8_) {
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ::operator[](&local_cd0,(long)local_cfc);
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ::push_back((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   *)in_stack_ffffffffffffdab8.m_matrix,in_stack_ffffffffffffdab0);
    }
    local_cfc = local_cfc + 1;
  }
  sVar9 = std::
          vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
          ::size(&local_cf8);
  if (sVar9 != 0) {
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::clear((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
             *)0x718514);
    Eigen::Matrix<double,_3,_10,_0,_3,_10>::Matrix((Matrix<double,_3,_10,_0,_3,_10> *)0x718521);
    Eigen::Matrix<double,_10,_10,_0,_10,_10>::Matrix((Matrix<double,_10,_10,_0,_10,_10> *)0x718530);
    Eigen::Matrix<double,_1,_10,_1,_1,_10>::Matrix((Matrix<double,_1,_10,_1,_1,_10> *)0x71853f);
    PVar43.m_rhs = (RhsNested)in_stack_ffffffffffffdae8;
    PVar43.m_lhs = in_stack_ffffffffffffdaf0;
    PVar36.m_rhs = (RhsNested)in_stack_ffffffffffffdad8;
    PVar36.m_lhs = in_stack_ffffffffffffdae0;
    local_1540 = 0;
    while( true ) {
      uVar8 = local_1540;
      sVar9 = std::
              vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              ::size(&local_cf8);
      if (sVar9 <= uVar8) break;
      Eigen::DenseBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::Zero();
      Eigen::Matrix<double,3,10,0,3,10>::operator=
                ((Matrix<double,_3,_10,_0,_3,_10> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>_>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ::operator[](&local_cf8,local_1540);
      math::quaternion2rot(in_stack_ffffffffffffdbd0);
      local_159c = 0;
      while( true ) {
        iVar6 = local_159c;
        sVar7 = Indices::size(local_48);
        plVar5 = local_40;
        if ((int)sVar7 <= iVar6) break;
        iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
        (**(code **)(*plVar5 + 0x28))(local_1610,plVar5,(long)iVar6);
        plVar5 = local_40;
        iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
        (**(code **)(*plVar5 + 0x10))(local_1628,plVar5,(long)iVar6);
        PVar37 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                            CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        local_15c8 = PVar37;
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)
                   CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                   (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        local_16c0 = (non_const_type)
                     Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                               ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        PVar39 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                            CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        in_stack_ffffffffffffdda0 = PVar39.m_rhs.m_matrix;
        local_16b8 = PVar39;
        Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>>
        ::operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                     *)in_stack_ffffffffffffdad0.m_matrix,
                    (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)in_stack_ffffffffffffdac8);
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffdac0,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                    *)in_stack_ffffffffffffdab8.m_matrix);
        Eigen::Matrix<double,3,3,0,3,3>::
        Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>,0>>
                  ((Matrix<double,_3,_3,_0,_3,_3> *)
                   CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                   (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_0>_>
                    *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        plVar5 = local_40;
        iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
        (**(code **)(*plVar5 + 0x30))(local_1708,plVar5,(long)iVar6);
        PVar37 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                            CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        local_16f0 = PVar37;
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)
                   CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                   (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        fill3x10(in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
        PVar40 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                            CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                            (MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                            CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        in_stack_ffffffffffffdd70 = PVar40.m_rhs;
        local_1718 = PVar40;
        Eigen::MatrixBase<Eigen::Matrix<double,3,10,0,3,10>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)in_stack_ffffffffffffdac8,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                    *)in_stack_ffffffffffffdac0);
        local_159c = local_159c + 1;
      }
      Eigen::DenseBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>::Zero();
      Eigen::Matrix<double,10,10,0,10,10>::operator=
                ((Matrix<double,_10,_10,_0,_10,_10> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::DenseBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>::Zero();
      Eigen::Matrix<double,1,10,1,1,10>::operator=
                ((Matrix<double,_1,_10,_1,_1,_10> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_10,_1,_1,_10>_>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      local_1538 = 0.0;
      local_173c = 0;
      while( true ) {
        iVar6 = local_173c;
        sVar7 = Indices::size(local_48);
        plVar5 = local_40;
        if ((int)sVar7 <= iVar6) break;
        iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
        (**(code **)(*plVar5 + 0x28))(local_17b0,plVar5,(long)iVar6);
        plVar5 = local_40;
        iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
        (**(code **)(*plVar5 + 0x10))(local_17c8,plVar5,(long)iVar6);
        PVar37 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                            CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        local_1768 = PVar37;
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)
                   CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                   (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        plVar5 = local_40;
        iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
        (**(code **)(*plVar5 + 0x20))(local_17e0,plVar5,(long)iVar6);
        plVar5 = local_40;
        iVar6 = Indices::operator[]((Indices *)in_stack_ffffffffffffdab0,in_stack_ffffffffffffdaac);
        (**(code **)(*plVar5 + 0x30))(local_1820,plVar5,(long)iVar6);
        PVar37 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                            CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        local_1808 = PVar37;
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)
                   CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                   (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        fill3x10(in_stack_ffffffffffffdc98,in_stack_ffffffffffffdc90);
        local_1898 = (non_const_type)
                     Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                               ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        PVar39 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                            CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        local_1890 = PVar39;
        Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>>
        ::operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                     *)in_stack_ffffffffffffdad0.m_matrix,
                    (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)in_stack_ffffffffffffdac8);
        Eigen::Matrix<double,3,3,0,3,3>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const>>
                  ((Matrix<double,_3,_3,_0,_3,_3> *)
                   CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        Eigen::MatrixBase<Eigen::Matrix<double,3,10,0,3,10>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                   in_stack_ffffffffffffdad0.m_matrix,
                   (MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)in_stack_ffffffffffffdac8)
        ;
        Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffdac0,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>_>_>
                    *)in_stack_ffffffffffffdab8.m_matrix);
        Eigen::Matrix<double,3,10,0,3,10>::
        Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,10,0,3,10>const,Eigen::Matrix<double,3,10,0,3,10>const>,0>>
                  ((Matrix<double,_3,_10,_0,_3,_10> *)
                   CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                   (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_const_Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_0>_>
                    *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
                  ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffdac0);
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   in_stack_ffffffffffffdad0.m_matrix,
                   (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdac8);
        Eigen::
        MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
        ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)in_stack_ffffffffffffdac0,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)in_stack_ffffffffffffdab8.m_matrix);
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)
                   CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                   (EigenBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                    *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        local_1a48 = (non_const_type)
                     Eigen::DenseBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>::transpose
                               ((DenseBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                                CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        PVar41 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,10,0,3,10>>>::operator*
                           ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>_>
                             *)CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                            (MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                            CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        local_1a40 = PVar41;
        Eigen::MatrixBase<Eigen::Matrix<double,10,10,0,10,10>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> *)
                   in_stack_ffffffffffffdac8,
                   (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                    *)in_stack_ffffffffffffdac0);
        local_1a60 = (non_const_type)
                     Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                               ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        PVar42 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                           ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                            CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                            (MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                            CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        local_1a58 = PVar42;
        Eigen::MatrixBase<Eigen::Matrix<double,1,10,1,1,10>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)in_stack_ffffffffffffdac8,
                   (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_10,_0,_3,_10>,_0>_>
                    *)in_stack_ffffffffffffdac0);
        local_1a78 = (non_const_type)
                     Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                               ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                                CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        PVar38 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                           ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                            CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
        local_1a70 = PVar38;
        SVar12 = Eigen::internal::dense_product_base::operator_cast_to_double
                           ((dense_product_base<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                             *)PVar36.m_rhs);
        local_1538 = SVar12 + local_1538;
        local_173c = local_173c + 1;
      }
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x718f24);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x718f33);
      absolute_pose::f((Matrix<double,_10,_10,_0,_10,_10> *)PVar43.m_rhs,
                       (Matrix<double,_1,_10,_1,_1,_10> *)PVar36.m_lhs,(double)PVar36.m_rhs,
                       (Vector3d *)in_stack_ffffffffffffdad0.m_matrix);
      Jac(in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8,
          in_stack_ffffffffffffdba0);
      in_stack_ffffffffffffdc98 = local_1af0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x718f9a);
      local_1af8 = 0xbff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      in_stack_ffffffffffffdc90 =
           (Matrix<double,_3,_10,_0,_3,_10> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                      CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x718fd8);
      dVar1 = (in_stack_ffffffffffffdc90->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_>).m_storage.m_data.array
              [0];
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x71900c);
      dVar2 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x71904c);
      local_1b00 = dVar1 + dVar2 + *pSVar10;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x7190a4);
      SVar3 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x7190e5);
      SVar4 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x719119);
      dVar1 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x71914c);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = -SVar3;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = SVar4;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar1 * *pSVar10;
      auVar16 = vfmsub213sd_fma(auVar16,auVar24,auVar30);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x7191a4);
      SVar3 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x7191d7);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = SVar3;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = auVar16._0_8_;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = *pSVar10;
      auVar16 = vfnmadd213sd_fma(auVar17,auVar25,auVar31);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x719224);
      _Var13 = std::pow<double,int>
                         ((double)CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                          in_stack_ffffffffffffdaa4);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x719284);
      _Var14 = std::pow<double,int>
                         ((double)CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                          in_stack_ffffffffffffdaa4);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x7192e4);
      in_stack_ffffffffffffdbd0 =
           (quaternion_t *)
           std::pow<double,int>
                     ((double)CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                      in_stack_ffffffffffffdaa4);
      local_1b08 = auVar16._0_8_ + _Var13 + _Var14 + (double)in_stack_ffffffffffffdbd0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x71935a);
      in_stack_ffffffffffffdbb8 = (Matrix<double,_10,_10,_0,_10,_10> *)*pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x71938e);
      in_stack_ffffffffffffdba8 = (double)in_stack_ffffffffffffdbb8 * *pSVar10;
      in_stack_ffffffffffffdbb0 =
           (Matrix<double,_1,_10,_1,_1,_10> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                      CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x7193ce);
      SVar3 = (in_stack_ffffffffffffdbb0->
              super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage.m_data.array
              [0];
      in_stack_ffffffffffffdba0 =
           (Matrix3d *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                      CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x719404);
      dVar1 = (in_stack_ffffffffffffdba0->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
              [0];
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x71943d);
      dVar2 = *pSVar10;
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x71947f);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = in_stack_ffffffffffffdba8;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = SVar3;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = (dVar1 + dVar1) * dVar2 * *pSVar10;
      auVar16 = vfmadd213sd_fma(auVar18,auVar26,auVar32);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x7194d7);
      SVar3 = *pSVar10;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x71950c);
      auVar19._0_8_ =
           std::pow<double,int>
                     ((double)CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                      in_stack_ffffffffffffdaa4);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = SVar3;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = auVar16._0_8_;
      auVar19._8_8_ = 0;
      auVar16 = vfnmadd213sd_fma(auVar19,auVar27,auVar33);
      in_stack_ffffffffffffdb40 = auVar16._0_8_;
      in_stack_ffffffffffffdb48 =
           (Vector4d *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                      CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x719577);
      _Var13 = std::pow<double,int>
                         ((double)CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                          in_stack_ffffffffffffdaa4);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x7195b6);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = _Var13;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = in_stack_ffffffffffffdb40;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *pSVar10;
      auVar16 = vfnmadd213sd_fma(auVar20,auVar28,auVar34);
      pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                           CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                           CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x719601);
      SVar3 = *pSVar10;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0),0x719633);
      auVar21._0_8_ =
           std::pow<double,int>
                     ((double)CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                      in_stack_ffffffffffffdaa4);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = SVar3;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = auVar16._0_8_;
      auVar21._8_8_ = 0;
      auVar16 = vfnmadd213sd_fma(auVar21,auVar29,auVar35);
      local_1b10 = auVar16._0_8_;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      math::o3_roots((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdda0.m_matrix);
      local_1b38 = 0;
      while( true ) {
        sVar9 = std::vector<double,_std::allocator<double>_>::size(&local_1b28);
        if (sVar9 <= local_1b38) break;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_1b28,local_1b38);
        if (*pvVar11 < 0.0) break;
        local_1b38 = local_1b38 + 1;
      }
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::inverse
                ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::DenseBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::operator-
                ((DenseBase<Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 in_stack_ffffffffffffdac0);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>const>>
      ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                   *)in_stack_ffffffffffffdac0,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  in_stack_ffffffffffffdab8.m_matrix);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Inverse<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (EigenBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      math::cayley2rot((cayley_t *)in_stack_ffffffffffffdbd0);
      PVar43 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                          CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                          (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                          CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::Matrix<double,3,3,0,3,3>::
      Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
                ((Matrix<double,_3,_3,_0,_3,_3> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      math::rot2quaternion((rotation_t *)in_stack_ffffffffffffdd70);
      Eigen::Matrix<double,_10,_1,_0,_10,_1>::Matrix((Matrix<double,_10,_1,_0,_10,_1> *)0x719839);
      modules::upnp_fill_s(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
      PVar36 = Eigen::MatrixBase<Eigen::Matrix<double,3,10,0,3,10>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                          CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                          (MatrixBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_> *)
                          CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Matrix<double,3,10,0,3,10>,Eigen::Matrix<double,10,1,0,10,1>,0>>
      ::operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>
                   *)in_stack_ffffffffffffdad0.m_matrix,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdac8);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,10,0,3,10>,Eigen::Matrix<double,10,1,0,10,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x7198d0);
      in_stack_ffffffffffffdad0 =
           Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                     ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                      CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_ffffffffffffdab8.m_matrix,(Index)in_stack_ffffffffffffdab0,
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8));
      Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_ffffffffffffdab8.m_matrix,(Index)in_stack_ffffffffffffdab0,
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8));
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>::operator-
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_> *)
                 in_stack_ffffffffffffdac0);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>const>>
      ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>_>
                   *)in_stack_ffffffffffffdac0,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  in_stack_ffffffffffffdab8.m_matrix);
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,1>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_ffffffffffffdab8.m_matrix,(Index)in_stack_ffffffffffffdab0,
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8));
      Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      std::
      vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                   *)in_stack_ffffffffffffdab8.m_matrix,(value_type *)in_stack_ffffffffffffdab0);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdab8.m_matrix);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffdab8.m_matrix);
      local_1540 = local_1540 + 1;
    }
    sVar9 = std::
            vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
            ::size(in_RDI);
    if (sVar9 == 0) {
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ::operator[](&local_cf8,0);
      Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix
                ((Matrix<double,_4,_1,_0,_4,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (Matrix<double,_4,_1,_0,_4,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::Matrix<double,_10,_1,_0,_10,_1>::Matrix((Matrix<double,_10,_1,_0,_10,_1> *)0x719a7b);
      modules::upnp_fill_s(in_stack_ffffffffffffdb48,in_stack_ffffffffffffdb40);
      PVar36 = Eigen::MatrixBase<Eigen::Matrix<double,3,10,0,3,10>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_3,_10,_0,_3,_10>_> *)
                          CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                          (MatrixBase<Eigen::Matrix<double,_10,_1,_0,_10,_1>_> *)
                          CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Matrix<double,3,10,0,3,10>,Eigen::Matrix<double,10,1,0,10,1>,0>>
      ::operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>_>
                   *)in_stack_ffffffffffffdad0.m_matrix,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar36.m_lhs);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,10,0,3,10>,Eigen::Matrix<double,10,1,0,10,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_10,_0,_3,_10>,_Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      math::quaternion2rot(in_stack_ffffffffffffdbd0);
      Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x719b29);
      in_stack_ffffffffffffdab8 =
           Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                     ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                      CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_ffffffffffffdab8.m_matrix,(Index)in_stack_ffffffffffffdab0,
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8));
      Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_ffffffffffffdab8.m_matrix,(Index)in_stack_ffffffffffffdab0,
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8));
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>::operator-
                ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_> *)
                 PVar36.m_rhs);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>const>>
      ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>_>
                   *)PVar36.m_rhs,
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  in_stack_ffffffffffffdab8.m_matrix);
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,1>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_ffffffffffffdab8.m_matrix,(Index)in_stack_ffffffffffffdab0,
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8));
      Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false> *)
                 CONCAT44(in_stack_ffffffffffffdaac,in_stack_ffffffffffffdaa8),
                 (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)CONCAT44(in_stack_ffffffffffffdaa4,in_stack_ffffffffffffdaa0));
      std::
      vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                   *)in_stack_ffffffffffffdab8.m_matrix,(value_type *)in_stack_ffffffffffffdab0);
    }
  }
  local_cdd = 1;
  local_10cc = 1;
  std::
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::~vector((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             *)in_stack_ffffffffffffdab8.m_matrix);
  if ((local_cdd & 1) == 0) {
    std::
    vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
    ::~vector((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
               *)in_stack_ffffffffffffdab8.m_matrix);
  }
  std::
  vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::~vector((vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             *)in_stack_ffffffffffffdab8.m_matrix);
  return in_RDI;
}

Assistant:

transformations_t upnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  assert( indices.size() > 2 );
    
  Eigen::Matrix<double,3,3> F = Eigen::Matrix3d::Zero();
  for( int i = 0; i < (int) indices.size(); i++ )
  {
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    F += f * f.transpose();
  }
  
  Eigen::Matrix<double,3,3> H_inv = (indices.size() * Eigen::Matrix<double,3,3>::Identity()) - F;
  Eigen::Matrix<double,3,3> H = H_inv.inverse();
  
  Eigen::Matrix<double,3,10> I = Eigen::Matrix<double,3,10>::Zero();
  Eigen::Matrix<double,3,1> J = Eigen::Matrix<double,3,1>::Zero();
  Eigen::Matrix<double,3,10> Phi;
  
  for( int i = 0; i < (int) indices.size(); i++ )
  {
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    Eigen::Matrix<double,3,3> Vk = H * ( f * f.transpose() - Eigen::Matrix<double,3,3>::Identity() );
    Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[i]);
    Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
    
    fill3x10(p,Phi);
    I += Vk * Phi;
    J += Vk * v;
  }
  
  Eigen::Matrix<double,10,10> M = Eigen::Matrix<double,10,10>::Zero();
  Eigen::Matrix<double,1,10>  C = Eigen::Matrix<double,1,10>::Zero();
  double gamma = 0.0;
  
  for(int i = 0; i < (int) indices.size(); i++ )
  {    
    Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
    Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
    Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[i]);
    
    fill3x10(p,Phi);
    Eigen::Matrix<double,3,3> temp = f*f.transpose() - Eigen::Matrix<double,3,3>::Identity();
    Eigen::Matrix<double,3,10> Ai =  temp * (Phi + I);
    Eigen::Matrix<double,3, 1> bi = -temp * (  v + J);
    
    M     += (Ai.transpose() * Ai);
    C     += (bi.transpose() * Ai);
    gamma += (bi.transpose() * bi);
  }
  
  //now do the main computation
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > quaternions1;
  if( indices.size() > 4 )
    modules::upnp_main_sym( M, C, gamma, quaternions1 );
  else
    modules::upnp_main( M, C, gamma, quaternions1 );
  
  //prepare the output vector
  transformations_t transformations;
  
  //Round 1: chirality check
  std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > quaternions2;
  for( int i = 0; i < quaternions1.size(); i++ )
  {
    rotation_t Rinv = math::quaternion2rot(quaternions1[i].second);
    
    Eigen::Matrix<double,10,1> s;
    modules::upnp_fill_s( quaternions1[i].second, s );
    translation_t tinv = I*s - J;
    
    if( transformations.size() == 0 )
    {
      transformation_t newTransformation;
      newTransformation.block<3,3>(0,0) = Rinv.transpose();
      newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
      transformations.push_back(newTransformation);
    }
    
    int count_negative = 0;
    
    for( int j = 0; j < (int) indices.size(); j++ )
    {
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[j]) * adapter.getBearingVector(indices[j]);
      Eigen::Matrix<double,3,1> p = adapter.getPoint(indices[j]);
      Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[j]);
      
      Eigen::Vector3d p_est = Rinv*p + tinv - v;
      
      if( p_est.transpose()*f < 0.0 )
        count_negative++;
    }
    
    if( count_negative < floor(0.2 * indices.size() + 0.5) )
      quaternions2.push_back(quaternions1[i]);
  }
  
  if( quaternions2.size() == 0 )
    return transformations;
  else
    transformations.clear();
  
  //Round 2: Second order optimality (plus polishing)
  Eigen::Matrix<double,3,10> I_cay;
  Eigen::Matrix<double,10,10> M_cay;
  Eigen::Matrix<double,1,10>  C_cay;
  double gamma_cay;
  
  for( size_t q = 0; q < quaternions2.size(); q++ )
  {    
    I_cay = Eigen::Matrix<double,3,10>::Zero();
    rotation_t Rinv = math::quaternion2rot(quaternions2[q].second);
    
    for( int i = 0; i < (int) indices.size(); i++ )
    {
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
      Eigen::Matrix<double,3,3> Vk = H * ( f * f.transpose() - Eigen::Matrix<double,3,3>::Identity() );
      Eigen::Matrix<double,3,1> p = Rinv * adapter.getPoint(indices[i]);
      
      fill3x10(p,Phi);
      I_cay += Vk * Phi;
    }
    
    M_cay = Eigen::Matrix<double,10,10>::Zero();
    C_cay = Eigen::Matrix<double,1,10>::Zero();
    gamma_cay = 0.0;
    
    for(int i = 0; i < (int) indices.size(); i++ )
    {    
      Eigen::Matrix<double,3,1> f = adapter.getCamRotation(indices[i]) * adapter.getBearingVector(indices[i]);
      Eigen::Matrix<double,3,1> v = adapter.getCamOffset(indices[i]);
      Eigen::Matrix<double,3,1> p = Rinv * adapter.getPoint(indices[i]);
      
      fill3x10(p,Phi);
      Eigen::Matrix<double,3,3> temp = f*f.transpose() - Eigen::Matrix<double,3,3>::Identity();
      Eigen::Matrix<double,3,10> Ai =  temp * (Phi + I_cay);
      Eigen::Matrix<double,3,1> bi = -temp * (  v + J);
      
      M_cay     += (Ai.transpose() * Ai);
      C_cay     += (bi.transpose() * Ai);
      gamma_cay += (bi.transpose() * bi);
    }
    
    //now analyze the eigenvalues of the "Hessian"
    Eigen::Vector3d val;
    Eigen::Matrix3d Jacobian;
    f( M_cay, C_cay, gamma_cay, val );
    Jac( M_cay, C_cay, gamma_cay, Jacobian );
    std::vector<double> characteristicPolynomial;
    characteristicPolynomial.push_back(-1.0);
    characteristicPolynomial.push_back(Jacobian(2,2)+Jacobian(1,1)+Jacobian(0,0));
    characteristicPolynomial.push_back(-Jacobian(2,2)*Jacobian(1,1)-Jacobian(2,2)*Jacobian(0,0)-Jacobian(1,1)*Jacobian(0,0)+pow(Jacobian(1,2),2)+pow(Jacobian(0,2),2)+pow(Jacobian(0,1),2));
    characteristicPolynomial.push_back(Jacobian(2,2)*Jacobian(1,1)*Jacobian(0,0)+2*Jacobian(1,2)*Jacobian(0,2)*Jacobian(0,1)-Jacobian(2,2)*pow(Jacobian(0,1),2)-pow(Jacobian(1,2),2)*Jacobian(0,0)-Jacobian(1,1)*pow(Jacobian(0,2),2));
    std::vector<double> roots = opengv::math::o3_roots( characteristicPolynomial );
    
    bool allPositive = true;
    for( size_t i = 0; i < roots.size(); i++ )
    {
      if( roots[i] < 0.0 )
      {
        allPositive = false;
        break;
      }
    }
    
    if( true )//allPositive)//use all results for the moment
    {
      //perform the polishing step
      Eigen::Vector3d cay = - Jacobian.inverse() * val;
      rotation_t Rinv2 = math::cayley2rot(cay) * Rinv;
      quaternion_t q = math::rot2quaternion(Rinv2);
      
      Eigen::Matrix<double,10,1> s;
      modules::upnp_fill_s(q,s);
      translation_t tinv = I*s - J;
      
      transformation_t newTransformation;
      newTransformation.block<3,3>(0,0) = Rinv2.transpose();
      newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
      transformations.push_back(newTransformation);
    }
  }
  
  //if there are no results, simply add the one with lowest score
  if( transformations.size() == 0 )
  {
    Eigen::Vector4d q = quaternions2[0].second;
    Eigen::Matrix<double,10,1> s;
    modules::upnp_fill_s(q,s);
    translation_t tinv = I*s - J;
    rotation_t Rinv = math::quaternion2rot(q);
    
    transformation_t newTransformation;
    newTransformation.block<3,3>(0,0) = Rinv.transpose();
    newTransformation.block<3,1>(0,3) = -newTransformation.block<3,3>(0,0) * tinv;
    transformations.push_back(newTransformation);
  }
  
  return transformations;
}